

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xmlschemastypes(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  int nr;
  int nr_00;
  uint uVar21;
  undefined8 uVar22;
  int n_name;
  uint uVar23;
  uint uVar24;
  undefined4 uVar25;
  xmlNodePtr val;
  undefined8 uVar26;
  undefined4 uVar27;
  int test_ret;
  int iVar28;
  uint *puVar29;
  int test_ret_2;
  int iVar30;
  uint uVar31;
  undefined8 *puVar32;
  int test_ret_11;
  int n_xws;
  int test_ret_1;
  int test_ret_6;
  int test_ret_7;
  int test_ret_5;
  int test_ret_9;
  int local_5c;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  int local_40;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing xmlschemastypes : 26 of 34 functions ...");
  }
  puVar32 = &DAT_00162d68;
  uVar23 = 0;
  iVar28 = 0;
  do {
    iVar1 = xmlMemBlocks();
    if (uVar23 < 4) {
      uVar22 = *puVar32;
    }
    else {
      uVar22 = 0;
    }
    xmlSchemaCheckFacet(0,0,0,uVar22);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaCheckFacet",(ulong)(uint)(iVar2 - iVar1));
      iVar28 = iVar28 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar23 = uVar23 + 1;
    puVar32 = puVar32 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  xmlSchemaCleanupTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  puVar32 = &DAT_00162d68;
  uVar23 = 0;
  local_5c = 0;
  do {
    iVar1 = xmlMemBlocks();
    if (uVar23 < 4) {
      uVar22 = *puVar32;
    }
    else {
      uVar22 = 0;
    }
    lVar16 = xmlSchemaCollapseString(uVar22);
    if (lVar16 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaCollapseString",(ulong)(uint)(iVar2 - iVar1));
      local_5c = local_5c + 1;
      printf(" %d",(ulong)uVar23);
      putchar(10);
    }
    uVar23 = uVar23 + 1;
    puVar32 = puVar32 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  iVar30 = 0;
  xmlSchemaCompareValues(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaCompareValues",(ulong)(uint)(iVar3 - iVar1));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar23 = 0;
  do {
    uVar24 = 0xffffffff;
    do {
      iVar3 = xmlMemBlocks();
      uVar19 = 0;
      uVar25 = 0;
      if (uVar23 - 1 < 3) {
        uVar25 = (&DAT_00152240)[uVar23 - 1];
      }
      if (uVar24 < 3) {
        uVar19 = (&DAT_00152240)[uVar24];
      }
      uVar24 = uVar24 + 1;
      xmlSchemaCompareValuesWhtsp(0,uVar25,0,uVar19);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaCompareValuesWhtsp",(ulong)(uint)(iVar4 - iVar3)
              );
        iVar30 = iVar30 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar23);
        printf(" %d",0);
        printf(" %d",(ulong)uVar24);
        putchar(10);
      }
    } while (uVar24 != 3);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 4);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlSchemaGetBuiltInListSimpleTypeItemType(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetBuiltInListSimpleTypeItemType",
           (ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar23 = 0xffffffff;
  do {
    uVar25 = 0;
    if (uVar23 < 3) {
      uVar25 = (&DAT_00152234)[uVar23];
    }
    xmlSchemaGetBuiltInType(uVar25);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar23 = uVar23 + 1;
  } while (uVar23 != 3);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlSchemaGetCanonValue(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetCanonValue",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar23 = 0xffffffff;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    uVar25 = 0;
    if (uVar23 < 3) {
      uVar25 = (&DAT_00152240)[uVar23];
    }
    uVar23 = uVar23 + 1;
    xmlSchemaGetCanonValueWhtsp(0,0,uVar25);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaGetCanonValueWhtsp",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
  } while (uVar23 != 3);
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlSchemaGetFacetValueAsULong(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetFacetValueAsULong",(ulong)(uint)(iVar10 - iVar8))
    ;
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar23 = 0;
  do {
    uVar24 = 0;
    puVar32 = &DAT_00162d68;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar23 < 4) {
        uVar22 = (&DAT_00162d68)[uVar23];
      }
      else {
        uVar22 = 0;
      }
      if (uVar24 < 4) {
        uVar26 = *puVar32;
      }
      else {
        uVar26 = 0;
      }
      xmlSchemaGetPredefinedType(uVar22,uVar26);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaGetPredefinedType",
               (ulong)(uint)(iVar12 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar23);
        printf(" %d");
        putchar(10);
      }
      uVar24 = uVar24 + 1;
      puVar32 = puVar32 + 1;
    } while (uVar24 != 5);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  xmlSchemaGetValType(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar11 != iVar12) {
    iVar13 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetValType",(ulong)(uint)(iVar13 - iVar11));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  xmlSchemaInitTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  puVar29 = &DAT_0015fd28;
  uVar23 = 0;
  local_4c = 0;
  do {
    iVar13 = xmlMemBlocks();
    val = (xmlNodePtr)0xffffffff;
    if (uVar23 < 4) {
      val = (xmlNodePtr)(ulong)*puVar29;
    }
    xmlSchemaIsBuiltInTypeFacet(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaIsBuiltInTypeFacet",(ulong)(uint)(iVar14 - iVar13)
            );
      local_4c = local_4c + 1;
      printf(" %d",0);
      val = (xmlNodePtr)(ulong)uVar23;
      printf(" %d");
      putchar(10);
    }
    uVar23 = uVar23 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar23 != 4);
  function_tests = function_tests + 1;
  local_48 = &DAT_00162d68;
  iVar13 = 0;
  uVar23 = 0;
  do {
    uVar24 = 0;
    do {
      iVar15 = (int)val;
      iVar14 = xmlMemBlocks();
      if (uVar23 < 4) {
        uVar22 = (&DAT_00162d68)[uVar23];
      }
      else {
        uVar22 = 0;
      }
      val = gen_xmlNodePtr(uVar24,iVar15);
      xmlSchemaValPredefTypeNode(0,uVar22,0,val);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar24,val,nr);
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValPredefTypeNode",
               (ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar23);
        printf(" %d",0);
        val = (xmlNodePtr)(ulong)uVar24;
        printf(" %d");
        putchar(10);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != 3);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar23 = 0;
  do {
    uVar24 = 0;
    do {
      iVar15 = (int)val;
      iVar14 = xmlMemBlocks();
      if (uVar23 < 4) {
        uVar22 = (&DAT_00162d68)[uVar23];
      }
      else {
        uVar22 = 0;
      }
      val = gen_xmlNodePtr(uVar24,iVar15);
      xmlSchemaValPredefTypeNodeNoNorm(0,uVar22,0,val);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar24,val,nr_00);
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValPredefTypeNodeNoNorm",
               (ulong)(uint)(iVar15 - iVar14));
        local_50 = local_50 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar23);
        printf(" %d",0);
        val = (xmlNodePtr)(ulong)uVar24;
        printf(" %d");
        putchar(10);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != 3);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 5);
  iVar28 = local_5c + iVar28 + (uint)(iVar1 != iVar2) + iVar30 + (uint)(iVar3 != iVar4) +
           (uint)(iVar5 != iVar6) + iVar7 + (uint)(iVar8 != iVar9) + iVar10 +
           (uint)(iVar11 != iVar12) + local_4c;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar23 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar23 < 4) {
      uVar22 = *local_48;
    }
    else {
      uVar22 = 0;
    }
    xmlSchemaValidateFacet(0,0,uVar22,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar2 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaValidateFacet",(ulong)(uint)(iVar30 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar23 = uVar23 + 1;
    local_48 = local_48 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  local_38 = &DAT_00162d68;
  local_4c = 0;
  uVar17 = 0;
  do {
    uVar23 = (int)uVar17 - 1;
    uVar18 = 0;
    do {
      uVar31 = (int)uVar18 - 1;
      uVar24 = 0;
      do {
        uVar21 = 0xffffffff;
        do {
          iVar2 = xmlMemBlocks();
          uVar19 = 0;
          uVar25 = 0;
          if (uVar23 < 3) {
            uVar25 = (&DAT_00152240)[uVar23];
          }
          if (uVar31 < 3) {
            uVar19 = (&DAT_00152234)[uVar31];
          }
          if (uVar24 < 4) {
            uVar22 = (&DAT_00162d68)[uVar24];
          }
          else {
            uVar22 = 0;
          }
          uVar27 = 0;
          if (uVar21 < 3) {
            uVar27 = (&DAT_00152240)[uVar21];
          }
          uVar21 = uVar21 + 1;
          xmlSchemaValidateFacetWhtsp(0,uVar25,uVar19,uVar22,0,uVar27);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar30 = xmlMemBlocks();
          if (iVar2 != iVar30) {
            iVar30 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateFacetWhtsp",
                   (ulong)(uint)(iVar30 - iVar2));
            local_4c = local_4c + 1;
            printf(" %d",0);
            printf(" %d",uVar17);
            printf(" %d",uVar18);
            printf(" %d",(ulong)uVar24);
            printf(" %d",0);
            printf(" %d",(ulong)uVar21);
            putchar(10);
          }
        } while (uVar21 != 3);
        uVar24 = uVar24 + 1;
      } while (uVar24 != 5);
      uVar24 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar24;
    } while (uVar24 != 4);
    uVar23 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar23;
  } while (uVar23 != 4);
  iVar28 = iVar28 + iVar13 + local_50;
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar23 = 0;
  do {
    iVar2 = 0;
    do {
      iVar30 = xmlMemBlocks();
      if (uVar23 < 4) {
        uVar22 = (&DAT_00162d68)[uVar23];
      }
      else {
        uVar22 = 0;
      }
      uVar26 = 0;
      if (iVar2 == 0) {
        uVar26 = 0x1668f0;
      }
      xmlSchemaValidateLengthFacet(0,0,uVar22,0,uVar26);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar30 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidateLengthFacet",
               (ulong)(uint)(iVar3 - iVar30));
        local_40 = local_40 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",(ulong)uVar23);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 == 1);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar17 = 0;
  do {
    uVar23 = (int)uVar17 - 1;
    uVar24 = 0;
    do {
      uVar18 = 0;
      do {
        iVar2 = (int)uVar18;
        uVar22 = 0;
        if (iVar2 == 0) {
          uVar22 = 0x1668f0;
        }
        uVar31 = 0xffffffff;
        do {
          iVar30 = xmlMemBlocks();
          uVar25 = 0;
          if (uVar23 < 3) {
            uVar25 = (&DAT_00152234)[uVar23];
          }
          if (uVar24 < 4) {
            uVar26 = (&DAT_00162d68)[uVar24];
          }
          else {
            uVar26 = 0;
          }
          uVar19 = 0;
          if (uVar31 < 3) {
            uVar19 = (&DAT_00152240)[uVar31];
          }
          uVar31 = uVar31 + 1;
          xmlSchemaValidateLengthFacetWhtsp(0,uVar25,uVar26,0,uVar22,uVar19);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar30 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateLengthFacetWhtsp",
                   (ulong)(uint)(iVar3 - iVar30));
            local_50 = local_50 + 1;
            printf(" %d",0);
            printf(" %d",uVar17);
            printf(" %d",(ulong)uVar24);
            printf(" %d",0);
            printf(" %d",uVar18);
            printf(" %d");
            putchar(10);
          }
        } while (uVar31 != 3);
        uVar18 = (ulong)(iVar2 + 1);
      } while (iVar2 == 0);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 5);
    uVar23 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar23;
  } while (uVar23 != 4);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar23 = 0;
  do {
    uVar17 = 0;
    do {
      iVar30 = 0;
      do {
        iVar3 = xmlMemBlocks();
        if (uVar23 < 4) {
          uVar22 = (&DAT_00162d68)[uVar23];
        }
        else {
          uVar22 = 0;
        }
        uVar26 = 0xffffffffffffffff;
        if ((uint)uVar17 < 3) {
          uVar26 = (&DAT_00152250)[uVar17];
        }
        uVar20 = 0;
        if (iVar30 == 0) {
          uVar20 = 0x1668e8;
        }
        xmlSchemaValidateListSimpleTypeFacet(0,uVar22,uVar26,uVar20);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateListSimpleTypeFacet",
                 (ulong)(uint)(iVar4 - iVar3));
          iVar2 = iVar2 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar23);
          printf(" %d",uVar17);
          printf(" %d");
          putchar(10);
        }
        iVar30 = iVar30 + 1;
      } while (iVar30 == 1);
      uVar24 = (uint)uVar17 + 1;
      uVar17 = (ulong)uVar24;
    } while (uVar24 != 4);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  iVar30 = 0;
  uVar23 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar23 < 4) {
      uVar22 = *local_38;
    }
    else {
      uVar22 = 0;
    }
    xmlSchemaValidatePredefinedType(0,uVar22,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaValidatePredefinedType",
             (ulong)(uint)(iVar4 - iVar3));
      iVar30 = iVar30 + 1;
      printf(" %d",0);
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar23 = uVar23 + 1;
    local_38 = local_38 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlSchemaValueAppend(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaValueAppend",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlSchemaValueGetAsBoolean(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaValueGetAsBoolean",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlSchemaValueGetAsString(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaValueGetAsString",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar32 = &DAT_00162d68;
  uVar23 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (uVar23 < 4) {
      uVar22 = *puVar32;
    }
    else {
      uVar22 = 0;
    }
    lVar16 = xmlSchemaWhiteSpaceReplace(uVar22);
    if (lVar16 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaWhiteSpaceReplace",(ulong)(uint)(iVar11 - iVar10))
      ;
      iVar9 = iVar9 + 1;
      printf(" %d",(ulong)uVar23);
      putchar(10);
    }
    uVar23 = uVar23 + 1;
    puVar32 = puVar32 + 1;
  } while (uVar23 != 5);
  function_tests = function_tests + 1;
  uVar23 = iVar28 + iVar1 + local_4c + local_40 + local_50 + iVar2 + iVar30 + (uint)(iVar3 != iVar4)
           + (uint)(iVar5 != iVar6) + (uint)(iVar7 != iVar8) + iVar9;
  if (uVar23 != 0) {
    printf("Module xmlschemastypes: %d errors\n",(ulong)uVar23);
  }
  return uVar23;
}

Assistant:

static int
test_xmlschemastypes(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemastypes : 26 of 34 functions ...\n");
    test_ret += test_xmlSchemaCheckFacet();
    test_ret += test_xmlSchemaCleanupTypes();
    test_ret += test_xmlSchemaCollapseString();
    test_ret += test_xmlSchemaCompareValues();
    test_ret += test_xmlSchemaCompareValuesWhtsp();
    test_ret += test_xmlSchemaCopyValue();
    test_ret += test_xmlSchemaGetBuiltInListSimpleTypeItemType();
    test_ret += test_xmlSchemaGetBuiltInType();
    test_ret += test_xmlSchemaGetCanonValue();
    test_ret += test_xmlSchemaGetCanonValueWhtsp();
    test_ret += test_xmlSchemaGetFacetValueAsULong();
    test_ret += test_xmlSchemaGetPredefinedType();
    test_ret += test_xmlSchemaGetValType();
    test_ret += test_xmlSchemaInitTypes();
    test_ret += test_xmlSchemaIsBuiltInTypeFacet();
    test_ret += test_xmlSchemaNewFacet();
    test_ret += test_xmlSchemaNewNOTATIONValue();
    test_ret += test_xmlSchemaNewQNameValue();
    test_ret += test_xmlSchemaNewStringValue();
    test_ret += test_xmlSchemaValPredefTypeNode();
    test_ret += test_xmlSchemaValPredefTypeNodeNoNorm();
    test_ret += test_xmlSchemaValidateFacet();
    test_ret += test_xmlSchemaValidateFacetWhtsp();
    test_ret += test_xmlSchemaValidateLengthFacet();
    test_ret += test_xmlSchemaValidateLengthFacetWhtsp();
    test_ret += test_xmlSchemaValidateListSimpleTypeFacet();
    test_ret += test_xmlSchemaValidatePredefinedType();
    test_ret += test_xmlSchemaValueAppend();
    test_ret += test_xmlSchemaValueGetAsBoolean();
    test_ret += test_xmlSchemaValueGetAsString();
    test_ret += test_xmlSchemaValueGetNext();
    test_ret += test_xmlSchemaWhiteSpaceReplace();

    if (test_ret != 0)
	printf("Module xmlschemastypes: %d errors\n", test_ret);
    return(test_ret);
}